

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

Token * __thiscall TokenStream::next(Token *__return_storage_ptr__,TokenStream *this)

{
  undefined8 uVar1;
  unsigned_long_long uVar2;
  Token *pTVar3;
  
  if ((this->stash).super__Optional_base<Token,_true,_true>._M_payload.
      super__Optional_payload_base<Token>._M_engaged == false) {
    if ((this->supplier).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
      (__return_storage_ptr__->span).begin = 0;
      (__return_storage_ptr__->span).end = 0;
      __return_storage_ptr__->type = Dot;
      __return_storage_ptr__->value = '\0';
      *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
      pTVar3 = (Token *)(this->supplier)._M_invoker;
      __return_storage_ptr__[1].span.begin = (unsigned_long_long)pTVar3;
      if ((this->supplier).super__Function_base._M_manager != (_Manager_type)0x0) {
        pTVar3 = (Token *)&(this->supplier).super__Function_base._M_manager;
        uVar2 = *(unsigned_long_long *)((long)&(this->supplier).super__Function_base._M_functor + 8)
        ;
        (__return_storage_ptr__->span).begin =
             *(unsigned_long_long *)&(this->supplier).super__Function_base._M_functor;
        (__return_storage_ptr__->span).end = uVar2;
        *(_Manager_type *)&__return_storage_ptr__->type =
             (this->supplier).super__Function_base._M_manager;
        *(_Manager_type *)pTVar3 = (_Manager_type)0x0;
        (this->supplier)._M_invoker = (_Invoker_type)0x0;
      }
      *(undefined1 *)&__return_storage_ptr__[2].span.end = 0;
      return pTVar3;
    }
    (*(this->supplier)._M_invoker)(__return_storage_ptr__,(_Any_data *)this);
  }
  else {
    uVar1 = *(undefined8 *)
             ((long)&(this->stash).super__Optional_base<Token,_true,_true>._M_payload.
                     super__Optional_payload_base<Token>._M_payload + 0x10);
    __return_storage_ptr__->type = (int)uVar1;
    __return_storage_ptr__->value = (char)((ulong)uVar1 >> 0x20);
    *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
    uVar2 = (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
            super__Optional_payload_base<Token>._M_payload._M_value.span.end;
    (__return_storage_ptr__->span).begin =
         (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
         super__Optional_payload_base<Token>._M_payload._M_value.span.begin;
    (__return_storage_ptr__->span).end = uVar2;
    (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
    super__Optional_payload_base<Token>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

auto TokenStream::next() -> Token {
    if (!stash)
        return supplier();

    auto temp = stash.value();
    stash = std::nullopt;
    return temp;
}